

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_rex_scanfn(arg_rex *parent,char *argval)

{
  TRexBool TVar1;
  TRex *exp;
  int iVar2;
  undefined8 unaff_RBX;
  char *unaff_R14;
  char **unaff_retaddr;
  char *error;
  
  if (parent->count == (parent->hdr).maxcount) {
    iVar2 = 2;
  }
  else if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
    iVar2 = 0;
  }
  else {
    exp = trex_compile(unaff_R14,unaff_retaddr,(int)((ulong)unaff_RBX >> 0x20));
    TVar1 = trex_match(exp,argval);
    if (TVar1 == 0) {
      iVar2 = 7;
    }
    else {
      iVar2 = parent->count;
      parent->count = iVar2 + 1;
      parent->sval[iVar2] = argval;
      iVar2 = 0;
    }
    trex_free(exp);
  }
  return iVar2;
}

Assistant:

static int arg_rex_scanfn(struct arg_rex* parent, const char* argval) {
    int errorcode = 0;
    const TRexChar* error = NULL;
    TRex* rex = NULL;
    TRexBool is_match = TRex_False;

    if (parent->count == parent->hdr.maxcount) {
        /* maximum number of arguments exceeded */
        errorcode = ARG_ERR_MAXCOUNT;
    } else if (!argval) {
        /* a valid argument with no argument value was given. */
        /* This happens when an optional argument value was invoked. */
        /* leave parent argument value unaltered but still count the argument. */
        parent->count++;
    } else {
        struct privhdr* priv = (struct privhdr*)parent->hdr.priv;

        /* test the current argument value for a match with the regular expression */
        /* if a match is detected, record the argument value in the arg_rex struct */

        rex = trex_compile(priv->pattern, &error, priv->flags);
        is_match = trex_match(rex, argval);
        if (!is_match)
            errorcode = ARG_ERR_REGNOMATCH;
        else
            parent->sval[parent->count++] = argval;

        trex_free(rex);
    }

    ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
    return errorcode;
}